

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFunctionalTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::ShaderTests::init(ShaderTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"preprocessor",
             "Preprocessor Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"constants",
             "Constant Literal Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"linkage",
             "Linkage Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"conversions",
             "Type Conversion Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"conditionals",
             "Conditionals Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"declarations",
             "Declarations Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"swizzles",
             "Swizzle Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"functions",
             "Function Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"arrays",
             "Array Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"keywords",
             "Keyword Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"qualification_order"
             ,"Order Of Qualification Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"scoping",
             "Scoping of Declarations");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"negative",
             "Miscellaneous Negative Shader Compilation Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLibraryTest::ShaderLibraryTest
            ((ShaderLibraryTest *)pTVar1,(this->super_TestCaseGroup).m_context,"uniform_block",
             "Uniform block tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderDiscardTests::ShaderDiscardTests
            ((ShaderDiscardTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderIndexingTests::ShaderIndexingTests
            ((ShaderIndexingTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLoopTests::ShaderLoopTests((ShaderLoopTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderOperatorTests::ShaderOperatorTests
            ((ShaderOperatorTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderMatrixTests::ShaderMatrixTests
            ((ShaderMatrixTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderReturnTests::ShaderReturnTests
            ((ShaderReturnTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderStructTests::ShaderStructTests
            ((ShaderStructTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderSwitchTests::ShaderSwitchTests
            ((ShaderSwitchTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FragDepthTests::FragDepthTests((FragDepthTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderPrecisionTests::ShaderPrecisionTests
            ((ShaderPrecisionTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderBuiltinVarTests::ShaderBuiltinVarTests
            ((ShaderBuiltinVarTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderTextureFunctionTests::ShaderTextureFunctionTests
            ((ShaderTextureFunctionTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderDerivateTests::ShaderDerivateTests
            ((ShaderDerivateTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderBuiltinFunctionTests::ShaderBuiltinFunctionTests
            ((ShaderBuiltinFunctionTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderInvarianceTests::ShaderInvarianceTests
            ((ShaderInvarianceTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderFragDataTests::ShaderFragDataTests
            ((ShaderFragDataTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderConstExprTests::ShaderConstExprTests
            ((ShaderConstExprTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  RandomShaderTests::RandomShaderTests
            ((RandomShaderTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new ShaderLibraryTest			(m_context, "preprocessor",			"Preprocessor Tests"));
		addChild(new ShaderLibraryTest			(m_context, "constants",			"Constant Literal Tests"));
		addChild(new ShaderLibraryTest			(m_context, "linkage",				"Linkage Tests"));
		addChild(new ShaderLibraryTest			(m_context, "conversions",			"Type Conversion Tests"));
		addChild(new ShaderLibraryTest			(m_context, "conditionals",			"Conditionals Tests"));
		addChild(new ShaderLibraryTest			(m_context, "declarations",			"Declarations Tests"));
		addChild(new ShaderLibraryTest			(m_context, "swizzles",				"Swizzle Tests"));
		addChild(new ShaderLibraryTest			(m_context, "functions",			"Function Tests"));
		addChild(new ShaderLibraryTest			(m_context, "arrays",				"Array Tests"));
		addChild(new ShaderLibraryTest			(m_context, "keywords",				"Keyword Tests"));
		addChild(new ShaderLibraryTest			(m_context, "qualification_order",	"Order Of Qualification Tests"));
		addChild(new ShaderLibraryTest			(m_context, "scoping",				"Scoping of Declarations"));
		addChild(new ShaderLibraryTest			(m_context, "negative",				"Miscellaneous Negative Shader Compilation Tests"));
		addChild(new ShaderLibraryTest			(m_context, "uniform_block",		"Uniform block tests"));

		addChild(new ShaderDiscardTests			(m_context));
		addChild(new ShaderIndexingTests		(m_context));
		addChild(new ShaderLoopTests			(m_context));
		addChild(new ShaderOperatorTests		(m_context));
		addChild(new ShaderMatrixTests			(m_context));
		addChild(new ShaderReturnTests			(m_context));
		addChild(new ShaderStructTests			(m_context));
		addChild(new ShaderSwitchTests			(m_context));
		addChild(new FragDepthTests				(m_context));
		addChild(new ShaderPrecisionTests		(m_context));
		addChild(new ShaderBuiltinVarTests		(m_context));
		addChild(new ShaderTextureFunctionTests	(m_context)); // \todo [pyry] Move to builtin?
		addChild(new ShaderDerivateTests		(m_context)); // \todo [pyry] Move to builtin?
		addChild(new ShaderBuiltinFunctionTests	(m_context));
		addChild(new ShaderInvarianceTests		(m_context));
		addChild(new ShaderFragDataTests		(m_context));
		addChild(new ShaderConstExprTests		(m_context));

		addChild(new RandomShaderTests			(m_context));
	}